

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O0

int json_pointer_object_get_recursive(json_object *obj,char *path,json_object **value)

{
  undefined1 local_48 [4];
  int rc;
  json_pointer_get_result res;
  json_object **value_local;
  char *path_local;
  json_object *obj_local;
  
  res._24_8_ = value;
  obj_local._4_4_ = json_pointer_result_get_recursive(obj,path,(json_pointer_get_result *)local_48);
  if (obj_local._4_4_ == 0) {
    if (res._24_8_ != 0) {
      *(json_object **)res._24_8_ = res.parent;
    }
    obj_local._4_4_ = 0;
  }
  return obj_local._4_4_;
}

Assistant:

static int json_pointer_object_get_recursive(struct json_object *obj, char *path,
                                             struct json_object **value)
{
	struct json_pointer_get_result res;
	int rc;

	rc = json_pointer_result_get_recursive(obj, path, &res);
	if (rc)
		return rc;

	if (value)
		*value = res.obj;

	return 0;
}